

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O1

void calc4::EmitCppCode<__int128>
               (shared_ptr<const_calc4::Operator> *op,CompilationContext *context,ostream *ostream)

{
  _Rb_tree_header *p_Var1;
  OperatorInformation *pOVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr *pp_Var4;
  int iVar5;
  element_type *peVar6;
  long lVar7;
  char cVar8;
  pointer pOVar9;
  undefined8 this;
  ostream *poVar10;
  _Base_ptr p_Var11;
  ulong uVar12;
  _Rb_tree_node_base *p_Var13;
  long *plVar14;
  _Elt_pointer piVar15;
  __normal_iterator<calc4::(anonymous_namespace)::OperatorInformation_*,_std::vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>_>
  __i;
  long lVar16;
  OperatorInformation *pOVar17;
  iterator __end2;
  pointer pOVar18;
  int iVar19;
  _Self __tmp;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  infos;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  variableNames;
  bool local_101;
  CompilationContext *local_100;
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  local_f8;
  OperatorDefinition local_e0;
  _Deque_base<int,_std::allocator<int>_> local_b8;
  OperatorInformation *local_68;
  _Base_ptr *local_60;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  local_100 = context;
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <cstdint>",0x12);
  cVar8 = (char)ostream;
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <iostream>",0x13);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"#include <unordered_map>",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"std::unordered_map<",0x13);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"> ",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Memory",6);
  local_e0.name._M_dataplus._M_p._0_1_ = 0x3b;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_e0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"int ",4);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"GetChar",7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"()",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"return std::cin.get();",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"void ",5);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"Print",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"__int128_t",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," value)",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_e0.name._M_dataplus._M_p._0_1_ = 0x7b;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"std::cout << static_cast<char>(value);",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_e0.name._M_dataplus._M_p._0_1_ = 0x7d;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  local_f8.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (OperatorInformation *)0x0;
  local_f8.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (OperatorInformation *)0x0;
  local_f8.
  super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pp_Var4 = &local_58._M_parent;
  local_58._M_parent._0_5_ = 0x5f6e69616d;
  local_58._M_parent._5_3_ = 0x65706f;
  local_58._M_left._0_5_ = 0x726f746172;
  local_58._M_color = 0xd;
  local_58._4_4_ = 0;
  local_58._M_left._5_1_ = 0;
  paVar3 = &local_e0.name.field_2;
  local_e0.name._M_dataplus._M_p = (pointer)paVar3;
  local_60 = pp_Var4;
  std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pp_Var4);
  local_e0._32_8_ = (ulong)(uint)local_e0._36_4_ << 0x20;
  local_101 = true;
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
  ::emplace_back<calc4::OperatorDefinition,std::shared_ptr<calc4::Operator_const>const&,bool>
            ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
              *)&local_f8,&local_e0,op,&local_101);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.name._M_dataplus._M_p != paVar3) {
    operator_delete(local_e0.name._M_dataplus._M_p,
                    (ulong)(local_e0.name.field_2._M_allocated_capacity + 1));
  }
  if (local_60 != pp_Var4) {
    operator_delete(local_60,CONCAT35(local_58._M_parent._5_3_,local_58._M_parent._0_5_) + 1);
  }
  p_Var11 = (local_100->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(local_100->userDefinedOperators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    do {
      local_e0.name._M_dataplus._M_p = local_e0.name._M_dataplus._M_p & 0xffffffffffffff00;
      std::
      vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
      ::
      emplace_back<calc4::OperatorDefinition_const&,std::shared_ptr<calc4::Operator_const>const&,bool>
                ((vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>
                  *)&local_f8,(OperatorDefinition *)(p_Var11 + 2),
                 (shared_ptr<const_calc4::Operator> *)&p_Var11[3]._M_parent,(bool *)&local_e0);
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  pOVar9 = local_f8.
           super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pOVar18 = local_f8.
            super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pOVar2 = local_f8.
           super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
  if (pOVar2 != local_f8.
                super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    lVar16 = (long)local_f8.
                   super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2;
    uVar12 = lVar16 >> 6;
    lVar7 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
              (pOVar2,local_f8.
                      super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
                      ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar16 < 0x401) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar2,pOVar9);
    }
    else {
      pOVar17 = pOVar18 + 0x11;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Iter_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                (pOVar2,pOVar17);
      for (; pOVar17 != pOVar9; pOVar17 = pOVar17 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<calc4::(anonymous_namespace)::OperatorInformation*,std::vector<calc4::(anonymous_namespace)::OperatorInformation,std::allocator<calc4::(anonymous_namespace)::OperatorInformation>>>,__gnu_cxx::__ops::_Val_comp_iter<calc4::EmitCppCode<__int128>(std::shared_ptr<calc4::Operator_const>const&,calc4::CompilationContext_const&,std::ostream&)::_lambda(auto:1&,auto:2&)_1_>>
                  (pOVar17);
      }
    }
  }
  if (pOVar18 != pOVar9) {
    do {
      anon_unknown_0::EmitDeclaration<__int128>(pOVar18,ostream);
      local_e0.name._M_dataplus._M_p._0_1_ = 0x3b;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      pOVar18 = pOVar18 + 1;
    } while (pOVar18 != pOVar9);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  anon_unknown_0::GatherVariableNames
            ((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_60,op,local_100);
  if (local_38 != 0) {
    for (p_Var13 = (_Rb_tree_node_base *)
                   CONCAT26(local_58._M_left._6_2_,
                            CONCAT15(local_58._M_left._5_1_,local_58._M_left._0_5_));
        p_Var13 != &local_58; p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"__int128_t",10);
      local_e0.name._M_dataplus._M_p._0_1_ = 0x20;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_e0,1);
      lVar7 = *(long *)(p_Var13 + 1);
      p_Var11 = p_Var13[1]._M_parent;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"user_defined_var_",0x11);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)p_Var11,lVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = 0;",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
    std::ostream::put(cVar8);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(ostream,"int main()",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
  std::ostream::put(cVar8);
  std::ostream::flush();
  local_e0.name._M_dataplus._M_p._0_1_ = 0x7b;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"    ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"std::cout << ",0xd);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,"main_operator",0xd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"() << std::endl;",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  local_e0.name._M_dataplus._M_p._0_1_ = 0x7d;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  plVar14 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
  std::ostream::put((char)plVar14);
  std::ostream::flush();
  local_68 = local_f8.
             super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_f8.
      super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pOVar18 = local_f8.
              super__Vector_base<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pOVar18->isMain == false) {
        std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
        std::ostream::put(cVar8);
        std::ostream::flush();
      }
      anon_unknown_0::EmitDeclaration<__int128>(pOVar18,ostream);
      std::ios::widen((char)*(undefined8 *)(*(long *)ostream + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      local_e0.name._M_dataplus._M_p._0_1_ = 0x7b;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,(char *)&local_e0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,"Entry",5);
      local_e0.name._M_dataplus._M_p._0_1_ = 0x3a;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_e0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      local_e0.name._M_dataplus._M_p = (pointer)&PTR_Visit_0014ab98;
      local_e0.name.field_2._M_allocated_capacity = (size_type)local_100;
      local_e0._32_8_ = -0xffffffff;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_e0.name._M_string_length = (size_type)pOVar18;
      local_e0.name.field_2._8_8_ = ostream;
      std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_b8,0);
      peVar6 = (pOVar18->op).super___shared_ptr<const_calc4::Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (**peVar6->_vptr_Operator)(peVar6,&local_e0);
      piVar15 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        piVar15 = local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      iVar5 = piVar15[-1];
      if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_b8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x80;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_first + 0x7f;
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      if (-1 < iVar5) {
        if (0 < local_e0.numOperands) {
          iVar19 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e0.name.field_2._8_8_,"    ",4);
            iVar19 = iVar19 + 1;
          } while (iVar19 < local_e0.numOperands);
        }
        this = local_e0.name.field_2._8_8_;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_e0.name.field_2._8_8_,"return ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"var_",4);
        poVar10 = (ostream *)std::ostream::operator<<((void *)this,iVar5);
        local_101 = true;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_101,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
      }
      local_101 = true;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>(ostream,&local_101,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      std::ostream::put((char)poVar10);
      std::ostream::flush();
      local_e0.name._M_dataplus._M_p = (pointer)&PTR_Visit_0014ab98;
      std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_b8);
      pOVar18 = pOVar18 + 1;
    } while (pOVar18 != local_68);
  }
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&local_60);
  std::
  vector<calc4::(anonymous_namespace)::OperatorInformation,_std::allocator<calc4::(anonymous_namespace)::OperatorInformation>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

void EmitCppCode(const std::shared_ptr<const Operator>& op, const CompilationContext& context,
                 std::ostream& ostream)
{
    /* Emit header */
    ostream << "#include <cstdint>" << std::endl;

#ifdef ENABLE_GMP
    if constexpr (std::is_same_v<TNumber, mpz_class>)
    {
        ostream << "#include <gmpxx.h>" << std::endl;
    }
#endif // ENABLE_GMP

    ostream << "#include <iostream>" << std::endl;
    ostream << "#include <unordered_map>" << std::endl;
    ostream << std::endl;
    ostream << "std::unordered_map<" << TypeName<TNumber>() << ", " << TypeName<TNumber>() << "> "
            << MemoryFieldName() << ';' << std::endl;
    ostream << std::endl;
    ostream << "int " << GetCharFunctionName() << "()" << std::endl;
    ostream << "{" << std::endl;
    ostream << IndentText << "return std::cin.get();" << std::endl;
    ostream << "}" << std::endl;
    ostream << std::endl;
    ostream << "void " << PrintFunctionName() << "(" << TypeName<TNumber>() << " value)"
            << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << static_cast<char>(value);" << std::endl;
    ostream << '}' << std::endl;
    ostream << std::endl;

    /* Gather information of operators and sort */
    std::vector<OperatorInformation> infos;
    infos.emplace_back(OperatorDefinition(std::string(MainOperatorName), 0), op, true);

    for (auto it = context.UserDefinedOperatorBegin(); it != context.UserDefinedOperatorEnd(); it++)
    {
        infos.emplace_back(it->second.GetDefinition(), it->second.GetOperator(), false);
    }

    std::sort(infos.begin() + 1, infos.end(), [](auto& left, auto& right) {
        return left.definition.GetName() < right.definition.GetName();
    });

    /* Emit forward declarations */
    for (auto& info : infos)
    {
        EmitDeclaration<TNumber>(info, ostream);
        ostream << ';' << std::endl;
    }

    ostream << std::endl;

    /* Gather variable names */
    std::set<std::string_view> variableNames = GatherVariableNames(op, context);

    /* Emit variable definitions */
    if (!variableNames.empty())
    {
        for (auto& variableName : variableNames)
        {
            ostream << TypeName<TNumber>() << ' ' << UserDefinedVariableName(variableName)
                    << " = 0;" << std::endl;
        }

        ostream << std::endl;
    }

    /* Emit main */
    ostream << "int main()" << std::endl;
    ostream << '{' << std::endl;
    ostream << IndentText << "std::cout << " << MainOperatorName << "() << std::endl;" << std::endl;
    ostream << '}' << std::endl << std::endl;

    /* Emit definitions */
    for (auto& info : infos)
    {
        if (!info.isMain)
        {
            ostream << std::endl;
        }

        EmitOperator<TNumber>(info, context, ostream);
    }
}